

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O2

IRType lj_opt_narrow_forl(jit_State *J,cTValue *tv)

{
  double dVar1;
  int iVar2;
  IRType IVar3;
  double dVar4;
  
  iVar2 = narrow_forl(J,tv);
  IVar3 = IRT_NUM;
  if (iVar2 != 0) {
    iVar2 = narrow_forl(J,tv + 1);
    if (iVar2 != 0) {
      iVar2 = narrow_forl(J,tv + 2);
      if (iVar2 != 0) {
        dVar1 = tv[2].n;
        dVar4 = tv[1].n + dVar1;
        if (0.0 <= dVar1) {
          if (2147483647.0 < dVar4) {
            return IRT_NUM;
          }
        }
        else if (dVar4 < -2147483648.0) {
          return IRT_NUM;
        }
        IVar3 = IRT_IGC;
      }
    }
  }
  return IVar3;
}

Assistant:

IRType lj_opt_narrow_forl(jit_State *J, cTValue *tv)
{
  lj_assertJ(tvisnumber(&tv[FORL_IDX]) &&
	     tvisnumber(&tv[FORL_STOP]) &&
	     tvisnumber(&tv[FORL_STEP]),
	     "expected number types");
  /* Narrow only if the runtime values of start/stop/step are all integers. */
  if (narrow_forl(J, &tv[FORL_IDX]) &&
      narrow_forl(J, &tv[FORL_STOP]) &&
      narrow_forl(J, &tv[FORL_STEP])) {
    /* And if the loop index can't possibly overflow. */
    lua_Number step = numberVnum(&tv[FORL_STEP]);
    lua_Number sum = numberVnum(&tv[FORL_STOP]) + step;
    if (0 <= step ? (sum <= 2147483647.0) : (sum >= -2147483648.0))
      return IRT_INT;
  }
  return IRT_NUM;
}